

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVerifier.cpp
# Opt level: O1

uint __thiscall
llvm::DWARFVerifier::verifyNameIndexBuckets
          (DWARFVerifier *this,NameIndex *NI,DataExtractor *StrData)

{
  uint32_t uVar1;
  pointer pBVar2;
  raw_ostream *prVar3;
  ulong uVar4;
  pointer pBVar5;
  NameIndex *pNVar6;
  llvm *plVar7;
  char *pcVar8;
  ulong uVar9;
  tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_char_*&>,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<unsigned_int_&>_>
  *Params;
  uint uVar10;
  NameIndex *pNVar11;
  pointer pBVar12;
  undefined1 in_R8B;
  long lVar13;
  BucketInfo *pBVar14;
  uint32_t uVar15;
  _Vector_base<BucketInfo,_std::allocator<BucketInfo>_> *this_00;
  bool bVar16;
  StringRef Fmt;
  StringRef Fmt_00;
  StringRef Fmt_01;
  StringRef Fmt_02;
  StringRef Buffer;
  StringRef Buffer_00;
  StringRef Fmt_03;
  formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_char_*&>,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<unsigned_int_&>_>_>
  local_1a0;
  _func_int **local_110;
  pointer local_108;
  _func_int **local_100;
  undefined1 local_f8 [32];
  format_adapter local_d8;
  pointer local_d0;
  format_adapter local_c8;
  char **local_c0;
  format_adapter local_b8;
  pointer local_b0;
  uint local_a8;
  uint local_a4;
  DWARFVerifier *local_a0;
  uint local_98;
  uint32_t local_94;
  uint32_t FirstHash;
  uint32_t Hash;
  _func_int **local_88;
  _func_int **local_80;
  undefined8 local_78;
  uint32_t Bucket;
  undefined4 uStack_6c;
  NameIndex *local_68;
  pointer local_60;
  undefined1 local_54 [8];
  uint32_t Idx;
  ulong local_48;
  uint local_3c;
  pointer pBStack_38;
  uint32_t NextUncovered;
  
  uVar1 = (NI->Hdr).super_HeaderPOD.BucketCount;
  if (uVar1 == 0) {
    prVar3 = WithColor::warning((WithColor *)this->OS,(raw_ostream *)0xe85cd6,(StringRef)ZEXT816(0),
                                (bool)in_R8B);
    local_f8._8_8_ = NI->Base;
    local_f8._0_8_ = &PTR_anchor_01098918;
    Fmt.Length = 0x32;
    Fmt.Data = "Name Index @ {0:x} does not contain a hash table.\n";
    formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>_>_>::
    formatv_object((formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>_>_>
                    *)&local_1a0,Fmt,
                   (tuple<llvm::detail::provider_format_adapter<unsigned_long>_> *)local_f8);
    raw_ostream::operator<<(prVar3,&local_1a0.super_formatv_object_base);
    if (local_1a0.super_formatv_object_base.Replacements.
        super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1a0.super_formatv_object_base.Replacements.
                      super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1a0.super_formatv_object_base.Replacements.
                            super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1a0.super_formatv_object_base.Replacements.
                            super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_1a0.super_formatv_object_base.Adapters.
        super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1a0.super_formatv_object_base.Adapters.
                      super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1a0.super_formatv_object_base.Adapters.
                            super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1a0.super_formatv_object_base.Adapters.
                            super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    uVar10 = 0;
  }
  else {
    local_48 = 0;
    uVar10 = uVar1 + 1;
    local_a0 = this;
    local_68 = NI;
    if (uVar10 == 0) {
      pBVar2 = (pointer)0x0;
      local_60 = (pointer)0x0;
    }
    else {
      local_60 = (pointer)0x0;
      pBVar2 = std::_Vector_base<BucketInfo,_std::allocator<BucketInfo>_>::_M_allocate
                         ((_Vector_base<BucketInfo,_std::allocator<BucketInfo>_> *)(ulong)uVar10,
                          (size_t)NI);
      local_60 = pBVar2 + (long)(ulong)uVar10;
    }
    local_78 = (llvm *)((ulong)local_78._4_4_ << 0x20);
    uVar1 = (local_68->Hdr).super_HeaderPOD.BucketCount;
    _Bucket = (pointer)CONCAT44(uStack_6c,uVar1);
    pBStack_38 = pBVar2;
    if (uVar1 != 0) {
      NI = (NameIndex *)0x0;
      _FirstHash = &PTR_anchor_010989a8;
      local_80 = (_func_int **)&PTR_anchor_01098bf8;
      local_88 = (_func_int **)&PTR_anchor_01098918;
      local_48 = 0;
      do {
        pNVar11 = local_68;
        local_3c = DWARFDebugNames::NameIndex::getBucketArrayEntry(local_68,(uint32_t)NI);
        if ((pNVar11->Hdr).super_HeaderPOD.NameCount < local_3c) {
          prVar3 = WithColor::error((WithColor *)local_a0->OS,(raw_ostream *)0xe85cd6,
                                    (StringRef)ZEXT816(0),(bool)in_R8B);
          local_d0 = (pointer)local_68->Base;
          local_f8._0_8_ = _FirstHash;
          local_f8._8_4_ = (local_68->Hdr).super_HeaderPOD.NameCount;
          local_f8._16_8_ = local_80;
          local_f8._24_8_ = &local_3c;
          local_d8._vptr_format_adapter = local_88;
          local_c8._vptr_format_adapter = local_80;
          local_c0 = (char **)&local_78;
          Fmt_00.Length = 0x56;
          Fmt_00.Data = 
          "Bucket {0} of Name Index @ {1:x} contains invalid value {2}. Valid range is [0, {3}].\n";
          formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>_>_>
          ::formatv_object((formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>_>_>
                            *)&local_1a0,Fmt_00,
                           (tuple<llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>_>
                            *)local_f8);
          raw_ostream::operator<<(prVar3,&local_1a0.super_formatv_object_base);
          if (local_1a0.super_formatv_object_base.Replacements.
              super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_1a0.super_formatv_object_base.Replacements.
                            super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_1a0.super_formatv_object_base.Replacements.
                                  super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_1a0.super_formatv_object_base.Replacements.
                                  super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if (local_1a0.super_formatv_object_base.Adapters.
              super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_1a0.super_formatv_object_base.Adapters.
                            super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_1a0.super_formatv_object_base.Adapters.
                                  super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_1a0.super_formatv_object_base.Adapters.
                                  super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          local_48 = (ulong)((int)local_48 + 1);
        }
        else if (local_3c != 0) {
          if (pBVar2 == local_60) {
            lVar13 = (long)pBVar2 - (long)pBStack_38;
            if (lVar13 == 0x7ffffffffffffff8) {
              std::__throw_length_error("vector::_M_realloc_insert");
            }
            uVar4 = lVar13 >> 3;
            uVar9 = uVar4;
            if (pBVar2 == pBStack_38) {
              uVar9 = 1;
            }
            this_00 = (_Vector_base<BucketInfo,_std::allocator<BucketInfo>_> *)(uVar9 + uVar4);
            if ((_Vector_base<BucketInfo,_std::allocator<BucketInfo>_> *)0xffffffffffffffe < this_00
               ) {
              this_00 = (_Vector_base<BucketInfo,_std::allocator<BucketInfo>_> *)0xfffffffffffffff;
            }
            if (CARRY8(uVar9,uVar4)) {
              this_00 = (_Vector_base<BucketInfo,_std::allocator<BucketInfo>_> *)0xfffffffffffffff;
            }
            pBVar5 = std::_Vector_base<BucketInfo,_std::allocator<BucketInfo>_>::_M_allocate
                               (this_00,(size_t)NI);
            *(uint32_t *)((long)pBVar5 + lVar13) = (uint32_t)local_78;
            *(uint *)((long)pBVar5 + lVar13 + 4) = local_3c;
            pBVar14 = pBVar5;
            for (pBVar12 = pBStack_38; pBVar2 != pBVar12; pBVar12 = pBVar12 + 1) {
              *pBVar14 = *pBVar12;
              pBVar14 = pBVar14 + 1;
            }
            if (pBStack_38 != (pointer)0x0) {
              operator_delete(pBStack_38,(long)local_60 - (long)pBStack_38);
            }
            pBVar2 = pBVar14 + 1;
            local_60 = pBVar5 + (long)this_00;
            pBStack_38 = pBVar5;
          }
          else {
            pBVar2->Bucket = (uint32_t)local_78;
            pBVar2->Index = local_3c;
            pBVar2 = pBVar2 + 1;
          }
        }
        uVar10 = (uint32_t)local_78 + 1;
        NI = (NameIndex *)(ulong)uVar10;
        local_78 = (llvm *)CONCAT44(local_78._4_4_,uVar10);
      } while (uVar10 < Bucket);
    }
    pBVar12 = pBStack_38;
    if ((int)local_48 == 0) {
      lVar13 = (long)pBVar2 - (long)pBStack_38;
      pNVar11 = (NameIndex *)(lVar13 >> 3);
      if (1 < (long)pNVar11) {
        NI = pNVar11;
        qsort(pBStack_38,(size_t)pNVar11,8,
              array_pod_sort_comparator<llvm::DWARFVerifier::verifyNameIndexBuckets(llvm::DWARFDebugNames::NameIndex_const&,llvm::DataExtractor_const&)::BucketInfo>
             );
      }
      uVar1 = (local_68->Hdr).super_HeaderPOD.BucketCount;
      uVar15 = (local_68->Hdr).super_HeaderPOD.NameCount + 1;
      if (pBVar2 == local_60) {
        if (lVar13 == 0x7ffffffffffffff8) {
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        pNVar6 = (NameIndex *)0x1;
        if (pBVar2 != pBStack_38) {
          pNVar6 = pNVar11;
        }
        _Bucket = (pointer)((long)(&(pNVar11->Hdr).AugmentationString + -1) +
                           (long)(&pNVar6->Hdr + -1));
        if ((pointer)0xffffffffffffffe < _Bucket) {
          _Bucket = (pointer)0xfffffffffffffff;
        }
        if (CARRY8((ulong)pNVar6,(ulong)pNVar11)) {
          _Bucket = (pointer)0xfffffffffffffff;
        }
        register0x00000000 =
             std::_Vector_base<BucketInfo,_std::allocator<BucketInfo>_>::_M_allocate
                       ((_Vector_base<BucketInfo,_std::allocator<BucketInfo>_> *)_Bucket,(size_t)NI)
        ;
        *(uint32_t *)((long)register0x00000000 + lVar13) = uVar1;
        *(uint32_t *)((long)register0x00000000 + lVar13 + 4) = uVar15;
        local_108 = register0x00000000;
        for (pBVar12 = pBStack_38; pBVar2 != pBVar12; pBVar12 = pBVar12 + 1) {
          *local_108 = *pBVar12;
          local_108 = local_108 + 1;
        }
        if (pBStack_38 != (pointer)0x0) {
          operator_delete(pBStack_38,(long)local_60 - (long)pBStack_38);
        }
        local_60 = register0x00000000 + (long)_Bucket;
      }
      else {
        pBVar2->Bucket = uVar1;
        pBVar2->Index = uVar15;
        unique0x100009e4 = pBStack_38;
        local_108 = pBVar2;
      }
      local_3c = 1;
      if (register0x00000018 == local_108 + 1) {
        local_48 = 0;
        pBVar12 = register0x00000018;
      }
      else {
        local_48 = 0;
        _FirstHash = &PTR_anchor_010989a8;
        local_88 = (_func_int **)&PTR_anchor_01098bf8;
        local_80 = (_func_int **)&PTR_anchor_01098918;
        local_110 = (_func_int **)&PTR_anchor_01098c28;
        local_100 = (_func_int **)&PTR_anchor_01098948;
        pBVar2 = register0x00000018;
        do {
          if (local_3c < pBVar2->Index) {
            prVar3 = WithColor::error((WithColor *)local_a0->OS,(raw_ostream *)0xe85cd6,
                                      (StringRef)ZEXT816(0),(bool)in_R8B);
            local_d0 = (pointer)local_68->Base;
            local_f8._0_8_ = _FirstHash;
            local_f8._8_4_ = pBVar2->Index - 1;
            local_f8._16_8_ = local_88;
            local_f8._24_8_ = &local_3c;
            local_d8._vptr_format_adapter = local_80;
            Fmt_01.Length = 0x55;
            Fmt_01.Data = 
            "Name Index @ {0:x}: Name table entries [{1}, {2}] are not covered by the hash table.\n"
            ;
            formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>_>_>
            ::formatv_object((formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>_>_>
                              *)&local_1a0,Fmt_01,
                             (tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>_>
                              *)local_f8);
            raw_ostream::operator<<(prVar3,&local_1a0.super_formatv_object_base);
            if (local_1a0.super_formatv_object_base.Replacements.
                super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_1a0.super_formatv_object_base.Replacements.
                              super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_1a0.super_formatv_object_base.Replacements.
                                    super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_1a0.super_formatv_object_base.Replacements.
                                    super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if (local_1a0.super_formatv_object_base.Adapters.
                super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_1a0.super_formatv_object_base.Adapters.
                              super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_1a0.super_formatv_object_base.Adapters.
                                    super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_1a0.super_formatv_object_base.Adapters.
                                    super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            local_48 = (ulong)((int)local_48 + 1);
          }
          pNVar11 = local_68;
          local_54._0_4_ = pBVar2->Index;
          local_a8 = pBVar2->Bucket;
          local_a4 = (local_68->Hdr).super_HeaderPOD.BucketCount;
          Params = (tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_char_*&>,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<unsigned_int_&>_>
                    *)(ulong)local_a4;
          _Bucket = pBVar2;
          uVar10 = local_3c;
          if (local_a8 != local_a4) {
            local_98 = DWARFDebugNames::NameIndex::getHashArrayEntry(local_68,local_54._0_4_);
            pBVar2 = _Bucket;
            if (local_98 % (pNVar11->Hdr).super_HeaderPOD.BucketCount != _Bucket->Bucket) {
              prVar3 = WithColor::error((WithColor *)local_a0->OS,(raw_ostream *)0xe85cd6,
                                        (StringRef)ZEXT816(0),(bool)in_R8B);
              pBVar2 = _Bucket;
              local_c0 = (char **)local_68->Base;
              local_f8._0_8_ = _FirstHash;
              local_f8._8_4_ = local_98 % (local_68->Hdr).super_HeaderPOD.BucketCount;
              local_f8._16_8_ = local_88;
              local_f8._24_8_ = &local_98;
              local_d8._vptr_format_adapter = local_100;
              local_d0 = _Bucket;
              local_c8._vptr_format_adapter = local_80;
              Params = (tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_char_*&>,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<unsigned_int_&>_>
                        *)local_f8;
              Fmt_02.Length = 0x73;
              Fmt_02.Data = 
              "Name Index @ {0:x}: Bucket {1} is not empty but points to a mismatched hash value {2:x} (belonging to bucket {3}).\n"
              ;
              formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>_>_>
              ::formatv_object((formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>_>_>
                                *)&local_1a0,Fmt_02,
                               (tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>_>
                                *)Params);
              raw_ostream::operator<<(prVar3,&local_1a0.super_formatv_object_base);
              if (local_1a0.super_formatv_object_base.Replacements.
                  super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_1a0.super_formatv_object_base.Replacements.
                                super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)local_1a0.super_formatv_object_base.Replacements.
                                      super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_1a0.super_formatv_object_base.Replacements.
                                      super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              if (local_1a0.super_formatv_object_base.Adapters.
                  super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_1a0.super_formatv_object_base.Adapters.
                                super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)local_1a0.super_formatv_object_base.Adapters.
                                      super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_1a0.super_formatv_object_base.Adapters.
                                      super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              local_48 = (ulong)((int)local_48 + 1);
            }
            do {
              pNVar11 = local_68;
              if ((local_68->Hdr).super_HeaderPOD.NameCount < (uint)local_54._0_4_) break;
              local_94 = DWARFDebugNames::NameIndex::getHashArrayEntry(local_68,local_54._0_4_);
              uVar10 = local_94 % (pNVar11->Hdr).super_HeaderPOD.BucketCount;
              uVar1 = pBVar2->Bucket;
              if (uVar10 == uVar1) {
                DWARFDebugNames::NameIndex::getNameTableEntry
                          ((NameTableEntry *)&local_1a0,pNVar11,local_54._0_4_);
                local_f8._0_8_ =
                     local_1a0.super_formatv_object_base.Adapters.
                     super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
                plVar7 = (llvm *)DataExtractor::getCStr
                                           ((DataExtractor *)&local_1a0,(uint64_t *)local_f8);
                local_78 = plVar7;
                if (plVar7 == (llvm *)0x0) {
                  pcVar8 = (char *)0x0;
                }
                else {
                  pcVar8 = (char *)strlen((char *)plVar7);
                }
                Buffer.Length = 0x1505;
                Buffer.Data = pcVar8;
                uVar15 = caseFoldingDjbHash(plVar7,Buffer,(uint32_t)Params);
                if (uVar15 != local_94) {
                  uVar15 = 0;
                  prVar3 = WithColor::error((WithColor *)local_a0->OS,(raw_ostream *)0xe85cd6,
                                            (StringRef)ZEXT816(0),(bool)in_R8B);
                  plVar7 = local_78;
                  pBStack_38 = (pointer)local_68->Base;
                  if (local_78 == (llvm *)0x0) {
                    pcVar8 = (char *)0x0;
                  }
                  else {
                    pcVar8 = (char *)strlen((char *)local_78);
                  }
                  Buffer_00.Length = 0x1505;
                  Buffer_00.Data = pcVar8;
                  uVar15 = caseFoldingDjbHash(plVar7,Buffer_00,uVar15);
                  local_f8._0_8_ = local_88;
                  local_f8._8_8_ = &local_94;
                  local_f8._16_8_ = _FirstHash;
                  local_f8._24_4_ = uVar15;
                  local_d8._vptr_format_adapter = local_88;
                  local_d0 = (pointer)local_54;
                  local_c8._vptr_format_adapter = local_110;
                  local_c0 = (char **)&local_78;
                  local_b8._vptr_format_adapter = local_80;
                  local_b0 = pBStack_38;
                  Params = (tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_char_*&>,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<unsigned_int_&>_>
                            *)local_f8;
                  Fmt_03.Length = 0x60;
                  Fmt_03.Data = 
                  "Name Index @ {0:x}: String ({1}) at index {2} hashes to {3:x}, but the Name Index hash is {4:x}\n"
                  ;
                  formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_char_*&>,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<unsigned_int_&>_>_>
                  ::formatv_object(&local_1a0,Fmt_03,Params);
                  raw_ostream::operator<<(prVar3,&local_1a0.super_formatv_object_base);
                  if (local_1a0.super_formatv_object_base.Replacements.
                      super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>
                      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_1a0.super_formatv_object_base.Replacements.
                                    super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (long)local_1a0.super_formatv_object_base.Replacements.
                                          super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_1a0.super_formatv_object_base.Replacements.
                                          super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  }
                  if (local_1a0.super_formatv_object_base.Adapters.
                      super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
                      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_1a0.super_formatv_object_base.Adapters.
                                    super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (long)local_1a0.super_formatv_object_base.Adapters.
                                          super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_1a0.super_formatv_object_base.Adapters.
                                          super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  }
                  local_48 = (ulong)((int)local_48 + 1);
                }
                local_54._0_4_ = local_54._0_4_ + 1;
              }
              pBVar2 = _Bucket;
            } while (uVar10 == uVar1);
            uVar10 = local_54._0_4_;
            if ((uint)local_54._0_4_ < local_3c) {
              uVar10 = local_3c;
            }
          }
          local_3c = uVar10;
          pBVar12 = stack0xffffffffffffffb0;
        } while ((local_a8 != local_a4) &&
                (bVar16 = pBVar2 != local_108, pBVar2 = pBVar2 + 1, bVar16));
      }
    }
    if (pBVar12 != (pointer)0x0) {
      operator_delete(pBVar12,(long)local_60 - (long)pBVar12);
    }
    uVar10 = (uint)local_48;
  }
  return uVar10;
}

Assistant:

unsigned
DWARFVerifier::verifyNameIndexBuckets(const DWARFDebugNames::NameIndex &NI,
                                      const DataExtractor &StrData) {
  struct BucketInfo {
    uint32_t Bucket;
    uint32_t Index;

    constexpr BucketInfo(uint32_t Bucket, uint32_t Index)
        : Bucket(Bucket), Index(Index) {}
    bool operator<(const BucketInfo &RHS) const { return Index < RHS.Index; };
  };

  uint32_t NumErrors = 0;
  if (NI.getBucketCount() == 0) {
    warn() << formatv("Name Index @ {0:x} does not contain a hash table.\n",
                      NI.getUnitOffset());
    return NumErrors;
  }

  // Build up a list of (Bucket, Index) pairs. We use this later to verify that
  // each Name is reachable from the appropriate bucket.
  std::vector<BucketInfo> BucketStarts;
  BucketStarts.reserve(NI.getBucketCount() + 1);
  for (uint32_t Bucket = 0, End = NI.getBucketCount(); Bucket < End; ++Bucket) {
    uint32_t Index = NI.getBucketArrayEntry(Bucket);
    if (Index > NI.getNameCount()) {
      error() << formatv("Bucket {0} of Name Index @ {1:x} contains invalid "
                         "value {2}. Valid range is [0, {3}].\n",
                         Bucket, NI.getUnitOffset(), Index, NI.getNameCount());
      ++NumErrors;
      continue;
    }
    if (Index > 0)
      BucketStarts.emplace_back(Bucket, Index);
  }

  // If there were any buckets with invalid values, skip further checks as they
  // will likely produce many errors which will only confuse the actual root
  // problem.
  if (NumErrors > 0)
    return NumErrors;

  // Sort the list in the order of increasing "Index" entries.
  array_pod_sort(BucketStarts.begin(), BucketStarts.end());

  // Insert a sentinel entry at the end, so we can check that the end of the
  // table is covered in the loop below.
  BucketStarts.emplace_back(NI.getBucketCount(), NI.getNameCount() + 1);

  // Loop invariant: NextUncovered is the (1-based) index of the first Name
  // which is not reachable by any of the buckets we processed so far (and
  // hasn't been reported as uncovered).
  uint32_t NextUncovered = 1;
  for (const BucketInfo &B : BucketStarts) {
    // Under normal circumstances B.Index be equal to NextUncovered, but it can
    // be less if a bucket points to names which are already known to be in some
    // bucket we processed earlier. In that case, we won't trigger this error,
    // but report the mismatched hash value error instead. (We know the hash
    // will not match because we have already verified that the name's hash
    // puts it into the previous bucket.)
    if (B.Index > NextUncovered) {
      error() << formatv("Name Index @ {0:x}: Name table entries [{1}, {2}] "
                         "are not covered by the hash table.\n",
                         NI.getUnitOffset(), NextUncovered, B.Index - 1);
      ++NumErrors;
    }
    uint32_t Idx = B.Index;

    // The rest of the checks apply only to non-sentinel entries.
    if (B.Bucket == NI.getBucketCount())
      break;

    // This triggers if a non-empty bucket points to a name with a mismatched
    // hash. Clients are likely to interpret this as an empty bucket, because a
    // mismatched hash signals the end of a bucket, but if this is indeed an
    // empty bucket, the producer should have signalled this by marking the
    // bucket as empty.
    uint32_t FirstHash = NI.getHashArrayEntry(Idx);
    if (FirstHash % NI.getBucketCount() != B.Bucket) {
      error() << formatv(
          "Name Index @ {0:x}: Bucket {1} is not empty but points to a "
          "mismatched hash value {2:x} (belonging to bucket {3}).\n",
          NI.getUnitOffset(), B.Bucket, FirstHash,
          FirstHash % NI.getBucketCount());
      ++NumErrors;
    }

    // This find the end of this bucket and also verifies that all the hashes in
    // this bucket are correct by comparing the stored hashes to the ones we
    // compute ourselves.
    while (Idx <= NI.getNameCount()) {
      uint32_t Hash = NI.getHashArrayEntry(Idx);
      if (Hash % NI.getBucketCount() != B.Bucket)
        break;

      const char *Str = NI.getNameTableEntry(Idx).getString();
      if (caseFoldingDjbHash(Str) != Hash) {
        error() << formatv("Name Index @ {0:x}: String ({1}) at index {2} "
                           "hashes to {3:x}, but "
                           "the Name Index hash is {4:x}\n",
                           NI.getUnitOffset(), Str, Idx,
                           caseFoldingDjbHash(Str), Hash);
        ++NumErrors;
      }

      ++Idx;
    }
    NextUncovered = std::max(NextUncovered, Idx);
  }
  return NumErrors;
}